

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

int genNetherScaled(NetherNoise *nn,int *out,Range r,int mc,uint64_t sha)

{
  Range r_00;
  Range r_01;
  Range r_02;
  int iVar1;
  int iVar2;
  long lVar3;
  int y;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int *out_00;
  int iVar7;
  ulong uVar8;
  int local_70;
  int local_6c;
  NetherNoise *local_68;
  int local_5c;
  Range s;
  
  if (r.scale < 1) {
    r.scale = 4;
  }
  if (r.sy == 0) {
    r.sy = 1;
  }
  uVar4 = (ulong)r.sx;
  uVar8 = (ulong)r.sz;
  uVar6 = uVar4 * uVar8 * (long)r.sy;
  if (mc < 0x13) {
    for (lVar3 = 0; uVar6 - lVar3 != 0; lVar3 = lVar3 + 1) {
      out[lVar3] = 8;
    }
  }
  else {
    local_68 = nn;
    if (r.scale != 1) {
      r_00.x = r.x;
      r_00.scale = r.scale;
      r_00.z = r.z;
      r_00.sx = r.sx;
      r_00.sz = r.sz;
      r_00.y = r.y;
      r_00.sy = r.sy;
      iVar1 = mapNether3D(nn,out,r_00,1.0);
      return iVar1;
    }
    r_01.x = r.x;
    r_01.scale = 1;
    r_01.sy = r.sy;
    r_01.y = r.y;
    r_01.z = r.z;
    r_01.sx = r.sx;
    r_01.sz = r.sz;
    getVoronoiSrcRange(r_01);
    if (uVar6 < 2) {
      out_00 = (int *)0x0;
    }
    else {
      out_00 = out + uVar6;
      r_02.x = s.x;
      r_02.scale = s.scale;
      r_02.sy = s.sy;
      r_02.y = s.y;
      r_02.z = s.z;
      r_02.sx = s.sx;
      r_02.sz = s.sz;
      iVar1 = mapNether3D(local_68,out_00,r_02,1.0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    for (iVar1 = 0; iVar1 < r.sy; iVar1 = iVar1 + 1) {
      for (iVar5 = 0; iVar5 < (int)uVar8; iVar5 = iVar5 + 1) {
        for (iVar7 = 0; iVar7 < (int)uVar4; iVar7 = iVar7 + 1) {
          voronoiAccess3D(sha,r.x + iVar7,r.y + iVar1,r.z + iVar5,&local_6c,&local_5c,&local_70);
          if (out_00 == (int *)0x0) {
            iVar2 = getNetherBiome(local_68,local_6c,y,local_70,(float *)0x0);
          }
          else {
            iVar2 = out_00[((long)s.sz * ((long)local_5c - (long)s.y) + ((long)local_70 - (long)s.z)
                           ) * (long)s.sx + ((long)local_6c - (long)s.x)];
          }
          *out = iVar2;
          out = out + 1;
          uVar4 = (ulong)(uint)r.sx;
        }
        uVar8 = (ulong)(uint)r.sz;
      }
    }
  }
  return 0;
}

Assistant:

int genNetherScaled(const NetherNoise *nn, int *out, Range r, int mc, uint64_t sha)
{
    if (r.scale <= 0) r.scale = 4;
    if (r.sy == 0) r.sy = 1;

    uint64_t siz = (uint64_t)r.sx*r.sy*r.sz;

    if (mc <= MC_1_15)
    {
        uint64_t i;
        for (i = 0; i < siz; i++)
            out[i] = nether_wastes;
        return 0;
    }

    if (r.scale == 1)
    {
        Range s = getVoronoiSrcRange(r);
        int *src;
        if (siz > 1)
        {   // the source range is large enough that we can try optimizing
            src = out + siz;
            int err = mapNether3D(nn, src, s, 1.0);
            if (err)
                return err;
        }
        else
        {
            src = NULL;
        }

        int i, j, k;
        int *p = out;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    int x4, z4, y4;
                    voronoiAccess3D(sha, r.x+i, r.y+k, r.z+j, &x4, &y4, &z4);
                    if (src)
                    {
                        x4 -= s.x; y4 -= s.y; z4 -= s.z;
                        *p = src[(int64_t)y4*s.sx*s.sz + (int64_t)z4*s.sx + x4];
                    }
                    else
                    {
                        *p = getNetherBiome(nn, x4, y4, z4, NULL);
                    }
                    p++;
                }
            }
        }
        return 0;
    }
    else
    {
        return mapNether3D(nn, out, r, 1.0);
    }
}